

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O2

uint8 * rw::ps2::rasterLockPalette(Raster *raster,int32 lockMode)

{
  if ((raster->format & 0x6000) != 0) {
    if ((lockMode & 4U) == 0) {
      convertPalette(raster);
    }
    if ((lockMode & 2U) != 0) {
      *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 8;
    }
    if ((lockMode & 1U) != 0) {
      *(byte *)&raster->privateFlags = (byte)raster->privateFlags | 0x10;
    }
    return raster->palette;
  }
  return (uint8 *)0x0;
}

Assistant:

uint8*
rasterLockPalette(Raster *raster, int32 lockMode)
{
	if((raster->format & (Raster::PAL4 | Raster::PAL8)) == 0)
		return nil;
	if((lockMode & Raster::LOCKNOFETCH) == 0)
		convertPalette(raster);
	if(lockMode & Raster::LOCKREAD) raster->privateFlags |= Raster::PRIVATELOCK_READ_PALETTE;
	if(lockMode & Raster::LOCKWRITE) raster->privateFlags |= Raster::PRIVATELOCK_WRITE_PALETTE;
	return raster->palette;
}